

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O1

void google::protobuf::compiler::cpp::PublicImportDFS
               (FileDescriptor *fd,
               unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *fd_set)

{
  __hashtable *__h;
  long lVar1;
  pair<std::__detail::_Node_iterator<const_google::protobuf::FileDescriptor_*,_true,_false>,_bool>
  pVar2;
  FileDescriptor *dep;
  FileDescriptor *local_38;
  unordered_set<const_google::protobuf::FileDescriptor_*,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_30;
  
  if (0 < *(int *)(fd + 0x24)) {
    lVar1 = 0;
    do {
      local_38 = FileDescriptor::dependency(fd,*(int *)(*(long *)(fd + 0x48) + lVar1 * 4));
      local_30 = fd_set;
      pVar2 = std::
              _Hashtable<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::FileDescriptor_const*>,std::hash<google::protobuf::FileDescriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<google::protobuf::FileDescriptor_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<google::protobuf::FileDescriptor_const*,false>>>>
                        ((_Hashtable<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>,std::__detail::_Identity,std::equal_to<google::protobuf::FileDescriptor_const*>,std::hash<google::protobuf::FileDescriptor_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)fd_set,&local_38,&local_30);
      if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        PublicImportDFS(local_38,fd_set);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < *(int *)(fd + 0x24));
  }
  return;
}

Assistant:

static void PublicImportDFS(const FileDescriptor* fd,
                            std::unordered_set<const FileDescriptor*>* fd_set) {
  for (int i = 0; i < fd->public_dependency_count(); i++) {
    const FileDescriptor* dep = fd->public_dependency(i);
    if (fd_set->insert(dep).second) PublicImportDFS(dep, fd_set);
  }
}